

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genLoadRelationFunction_abi_cxx11_(CppGenerator *this)

{
  ulong uVar1;
  element_type *this_00;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t viewID;
  string rel_name;
  size_t rel;
  string returnString;
  size_t in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  TreeDecomposition *in_stack_fffffffffffff8d0;
  TDNode *in_stack_fffffffffffff8d8;
  CppGenerator *this_01;
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  ulong local_188;
  string local_180 [32];
  string local_160 [32];
  string local_140 [48];
  undefined1 local_110 [64];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  this_01 = (CppGenerator *)local_110;
  offset_abi_cxx11_(this_01,(size_t)in_RSI);
  std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
  offset_abi_cxx11_(this_01,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RSI
                );
  std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
  offset_abi_cxx11_(this_01,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RSI
                );
  std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
  offset_abi_cxx11_(this_01,(size_t)in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RSI
                );
  std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string((string *)(local_110 + 0x20));
  std::__cxx11::string::~string((string *)local_110);
  local_188 = 0;
  while( true ) {
    uVar1 = local_188;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x29ed2e);
    sVar2 = TreeDecomposition::numberOfRelations(this_00);
    if (sVar2 <= uVar1) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29ed5e);
    in_stack_fffffffffffff8d8 =
         TreeDecomposition::getRelation(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    std::__cxx11::string::string(local_1a8,(string *)in_stack_fffffffffffff8d8);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((char *)in_stack_fffffffffffff8d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::operator+=(local_30,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_228);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8d0);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::operator+=(local_30,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_628);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_5e8);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::string::~string(local_588);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::__cxx11::string::~string(local_568);
    std::__cxx11::string::~string(local_4e8);
    std::__cxx11::string::~string(local_508);
    std::__cxx11::string::~string(local_528);
    std::__cxx11::string::~string(local_548);
    std::__cxx11::string::~string(local_1a8);
    local_188 = local_188 + 1;
  }
  std::__cxx11::string::operator+=(local_30,"\n");
  local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar3 = local_650;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29fb49);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x29fb51);
    if (__rhs <= pbVar3) break;
    offset_abi_cxx11_(this_01,(size_t)in_RSI);
    std::operator+(&in_stack_fffffffffffff8d8->_name,__rhs);
    std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)__rhs);
    std::__cxx11::string::operator+=(local_30,local_670);
    std::__cxx11::string::~string(local_670);
    std::__cxx11::string::~string(local_690);
    std::__cxx11::string::~string(local_6b0);
    local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_650->field_0x1;
  }
  offset_abi_cxx11_(this_01,(size_t)in_RSI);
  std::operator+(&in_stack_fffffffffffff8d8->_name,__rhs);
  std::operator+(&in_stack_fffffffffffff8d8->_name,(char *)__rhs);
  std::__cxx11::string::~string(local_6d0);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string CppGenerator::genLoadRelationFunction()
{
    std::string returnString = offset(1)+"void loadRelations()\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        std::string rel_name = _td->getRelation(rel)->_name;
        
        returnString += "\n"+offset(2)+rel_name+".clear();\n";

        returnString += offset(2)+"input.open(PATH_TO_DATA + \"/"+rel_name+".tbl\");\n"+
            offset(2)+"if (!input)\n"+offset(2)+"{\n"+
            offset(3)+"std::cerr << PATH_TO_DATA + \""+rel_name+
            ".tbl does is not exist. \\n\";\n"+
            offset(3)+"exit(1);\n"+offset(2)+"}\n"+
            offset(2)+"while(getline(input, line))\n"+
            offset(3)+rel_name+".push_back("+rel_name+"_tuple(line));\n"+
            offset(2)+"input.close();\n";            
    }

    // Reserving space for the views to speed up push tuples to them.
    returnString += "\n";
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        returnString += offset(2)+viewName[viewID]+".reserve(1000000);\n";

    return returnString+offset(1)+"}\n";
}